

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_ObjectArray<ON_Layer> *a)

{
  bool bVar1;
  int iVar2;
  ON_Layer *object;
  int iVar3;
  int count;
  
  ON_ClassArray<ON_Layer>::Empty((ON_ClassArray<ON_Layer> *)a);
  bVar1 = ReadInt(this,&count);
  if (bVar1) {
    ON_ClassArray<ON_Layer>::SetCapacity((ON_ClassArray<ON_Layer> *)a,(long)count);
    iVar3 = -1;
    do {
      iVar3 = iVar3 + 1;
      if (count <= iVar3) {
        return true;
      }
      object = ON_ClassArray<ON_Layer>::AppendNew((ON_ClassArray<ON_Layer> *)a);
      iVar2 = ReadObject(this,(ON_Object *)object);
    } while (iVar2 == 1);
    ON_ClassArray<ON_Layer>::Remove((ON_ClassArray<ON_Layer> *)a);
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_ObjectArray<class ON_Layer>& a)
{
  a.Empty();
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      rc = (1 == ReadObject(a.AppendNew()));
      if (!rc)
      {
        a.Remove();
        break;
      }
    }
  }
  return rc;
}